

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMaj.c
# Opt level: O0

int Gem_GroupsDerive(word *pTruth,int nVars,word *pCof0,word *pCof1)

{
  int iVar1;
  undefined4 local_30;
  undefined4 local_2c;
  int Res;
  int v;
  word *pCof1_local;
  word *pCof0_local;
  int nVars_local;
  word *pTruth_local;
  
  local_30 = 1 << ((char)nVars - 1U & 0x1f);
  for (local_2c = 0; local_2c < nVars + -1; local_2c = local_2c + 1) {
    iVar1 = Abc_TtVarsAreSymmetric(pTruth,nVars,local_2c,local_2c + 1,pCof0,pCof1);
    if (iVar1 == 0) {
      local_30 = 1 << ((byte)local_2c & 0x1f) | local_30;
    }
  }
  return local_30;
}

Assistant:

int Gem_GroupsDerive( word * pTruth, int nVars, word * pCof0, word * pCof1 )
{
    int v, Res = 1 << (nVars-1);
    for ( v = 0; v < nVars-1; v++ )
        if ( !Abc_TtVarsAreSymmetric(pTruth, nVars, v, v+1, pCof0, pCof1) )
            Res |= (1 << v);
    return Res;
}